

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O1

bool __thiscall
Diligent::anon_unknown_25::ArchiveSerializer<(Diligent::SerializerMode)0>::SerializeShaders
          (ArchiveSerializer<(Diligent::SerializerMode)0> *this,ShadersVector *Shaders)

{
  pointer pSVar1;
  bool bVar2;
  bool bVar3;
  void *pData;
  pointer this_00;
  Uint32 NumShaders;
  void *local_68;
  void *local_60;
  uint local_54;
  SerializedData local_50;
  
  local_54 = 0;
  bVar2 = Serializer<(Diligent::SerializerMode)0>::Copy<unsigned_int>(this->Ser,&local_54,4);
  if (bVar2) {
    std::vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>::resize
              (Shaders,(ulong)local_54);
    this_00 = (Shaders->
              super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (Shaders->
             super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = this_00 == pSVar1;
    if (!bVar2) {
      local_60 = (void *)0x0;
      local_68 = (void *)0x0;
      bVar3 = Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                        (this->Ser,&local_68,(ConstQual<size_t> *)&local_60,8);
      if (bVar3) {
        do {
          pData = local_60;
          if (local_60 != (void *)0x0) {
            pData = local_68;
          }
          SerializedData::SerializedData(&local_50,pData,(size_t)local_60);
          SerializedData::operator=(this_00,&local_50);
          SerializedData::~SerializedData(&local_50);
          this_00 = this_00 + 1;
          bVar2 = this_00 == pSVar1;
          if (bVar2) {
            return bVar2;
          }
          local_60 = (void *)0x0;
          local_68 = (void *)0x0;
          bVar3 = Serializer<(Diligent::SerializerMode)0>::SerializeBytes
                            (this->Ser,&local_68,(ConstQual<size_t> *)&local_60,8);
        } while (bVar3);
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ArchiveSerializer<SerializerMode::Read>::SerializeShaders(ShadersVector& Shaders) const
{
    Uint32 NumShaders = 0;
    if (!Ser(NumShaders))
        return false;

    Shaders.resize(NumShaders);
    for (auto& Shader : Shaders)
    {
        if (!Ser.Serialize(Shader))
            return false;
    }

    return true;
}